

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O0

uint haar_ac_energy(MACROBLOCK *x,BLOCK_SIZE bs)

{
  uint uVar1;
  uint uVar2;
  int stride_00;
  int64_t iVar3;
  byte in_SIL;
  long in_RDI;
  int64_t var;
  int hbd;
  int num_8x8_rows;
  int num_8x8_cols;
  uint8_t *buf;
  int stride;
  MACROBLOCKD *xd;
  undefined8 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  
  uVar1 = block_size_wide[in_SIL] / 8;
  uVar2 = block_size_high[in_SIL] / 8;
  stride_00 = is_cur_buf_hbd((MACROBLOCKD *)(in_RDI + 0x1a0));
  iVar3 = av1_haar_ac_sad_mxn_uint8_input
                    ((uint8_t *)CONCAT44(uVar1,uVar2),stride_00,in_stack_ffffffffffffffc8,
                     (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0)
  ;
  return (uint)(iVar3 << 8) >>
         ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[in_SIL] & 0x1f);
}

Assistant:

static unsigned int haar_ac_energy(const MACROBLOCK *x, BLOCK_SIZE bs) {
  const MACROBLOCKD *xd = &x->e_mbd;
  int stride = x->plane[0].src.stride;
  const uint8_t *buf = x->plane[0].src.buf;
  const int num_8x8_cols = block_size_wide[bs] / 8;
  const int num_8x8_rows = block_size_high[bs] / 8;
  const int hbd = is_cur_buf_hbd(xd);

  int64_t var = av1_haar_ac_sad_mxn_uint8_input(buf, stride, hbd, num_8x8_rows,
                                                num_8x8_cols);

  return (unsigned int)((uint64_t)var * 256) >> num_pels_log2_lookup[bs];
}